

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<double> *original_costs,
            double cost_constant)

{
  FILE *theta;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  init_policy_type iVar4;
  context *ctx;
  context *ctx_00;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  rep rVar12;
  long lVar13;
  ulong uVar14;
  random_engine *rng;
  int iVar15;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  long lVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double ret;
  compute_order compute;
  solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  slv;
  double local_180;
  bit_array_impl local_168;
  double local_158;
  default_cost_type<double> *local_150;
  double local_148;
  int local_13c;
  bit_array_impl local_138;
  double local_128;
  double local_120;
  double local_118;
  cost_type local_110;
  double local_100;
  double local_f8;
  long local_f0;
  compute_order local_e8;
  solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  local_b0;
  undefined1 extraout_var [56];
  
  auVar20 = ZEXT1664(ZEXT816(0));
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar20;
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = auVar20;
  __return_storage_ptr__->strings = (string_buffer_ptr)auVar20._0_16_;
  (__return_storage_ptr__->method)._M_len = SUB168(auVar20._16_16_,0);
  (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar20._16_16_,8);
  (__return_storage_ptr__->affected_vars).names =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )auVar20._32_24_;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar20._56_8_;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_148 = cost_constant;
  bit_array_impl::bit_array_impl(&local_168,variables);
  ctx = this->m_ctx;
  normalize_costs<double,baryonyx::itm::default_cost_type<double>>
            ((itm *)&local_110,ctx,original_costs,this->m_rng,variables);
  local_120 = (ctx->parameters).kappa_step;
  local_158 = (ctx->parameters).delta;
  local_118 = (ctx->parameters).kappa_max;
  local_128 = (ctx->parameters).alpha;
  theta = (FILE *)(ctx->parameters).theta;
  if (local_158 < 0.0) {
    ctx_00 = this->m_ctx;
    local_b0.super_debug_logger<true>.ofs = theta;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar17 = ZEXT816(0x7fefffffffffffff);
    }
    else {
      auVar22._8_8_ = 0x7fffffffffffffff;
      auVar22._0_8_ = 0x7fffffffffffffff;
      uVar14 = 0;
      auVar1 = ZEXT816(0x7fefffffffffffff);
      do {
        auVar26._8_8_ = 0;
        auVar26._0_8_ =
             *(double *)
              ((long)local_110.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + uVar14 * 8);
        uVar14 = uVar14 + 1;
        auVar17 = vandpd_avx(auVar26,auVar22);
        uVar6 = vcmppd_avx512vl(auVar26,ZEXT816(0) << 0x40,4);
        uVar7 = vcmppd_avx512vl(auVar17,auVar1,1);
        bVar8 = (byte)uVar6 & 3 & (byte)uVar7 & 3;
        auVar17._0_8_ =
             (ulong)(bVar8 & 1) * auVar17._0_8_ + (ulong)!(bool)(bVar8 & 1) * auVar1._0_8_;
        auVar17._8_8_ = auVar1._8_8_;
        auVar1 = auVar17;
      } while ((uint)variables != uVar14);
    }
    local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar17._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = theta;
    auVar17 = vfnmadd132sd_fma(auVar17,auVar17,auVar1);
    local_138._0_8_ = auVar17._0_8_;
    info<double,double,double>
              (ctx_00,"    - delta={} (min normalized cost:{} / theta: {})\n",(double *)&local_138,
               (double *)&local_e8,(double *)&local_b0);
    local_158 = (double)local_138._0_8_;
  }
  local_f0 = (long)(ctx->parameters).w;
  local_f8 = (ctx->parameters).pushing_k_factor;
  local_100 = (ctx->parameters).pushing_objective_amplifier;
  solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::solver_equalities_01coeff
            (&local_b0,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_110,constraints);
  compute_order::compute_order(&local_e8,(ctx->parameters).order,variables);
  dVar19 = (this->m_ctx->parameters).init_policy_random;
  local_138._0_8_ = 0.0;
  local_138.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar4 = (ctx->parameters).init_policy;
  local_13c = variables;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)&local_168,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_168;
      x_optimistic = &local_138;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_0023c906;
      rng = this->m_rng;
      x_pessimistic = &local_138;
      x_optimistic = &local_168;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_0023c906:
  local_150 = original_costs;
  if (local_168.m_size != 0) {
    iVar15 = 0;
    do {
      dVar18 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar18 < dVar19) {
        bit_array_impl::invert(&local_168,iVar15);
      }
      iVar15 = iVar15 + 1;
    } while (local_168.m_size != iVar15);
  }
  if (local_138.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_138.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  local_180 = (ctx->parameters).kappa_min;
  rVar12 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar12;
  rVar12 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar12;
  compute_order::
  init<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
            (&local_e8,&local_b0,(bit_array *)&local_168);
  if ((ctx->parameters).limit != 0) {
    iVar15 = 0x7fffffff;
    lVar16 = 0;
    while( true ) {
      iVar9 = compute_order::
              run<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                        (&local_e8,&local_b0,(bit_array *)&local_168,this->m_rng,local_180,local_158
                         ,(double)theta);
      if (iVar9 == 0) {
        dVar19 = default_cost_type<double>::results(local_150,(bit_array *)&local_168,local_148);
        store_if_better(this,(bit_array *)&local_168,dVar19,lVar16);
        auVar20 = ZEXT864((ulong)local_180);
        if ((ctx->parameters).pushes_limit < 1) goto LAB_0023ca8f;
        iVar15 = 0;
        iVar9 = 0;
        goto LAB_0023cb99;
      }
      if (iVar9 < iVar15) {
        store_if_better(this,(bit_array *)&local_168,iVar9,lVar16);
        iVar15 = iVar9;
      }
      if (local_f0 < lVar16) {
        auVar21._0_8_ = pow((double)iVar9 / (double)local_b0.m,local_128);
        auVar21._8_56_ = extraout_var;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_180;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_120;
        auVar17 = vfmadd231sd_fma(auVar23,auVar21._0_16_,auVar2);
        local_180 = auVar17._0_8_;
      }
      if (local_118 < local_180) break;
      lVar13 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar13;
      dVar19 = (this->m_ctx->parameters).time_limit;
      if (((0.0 < dVar19) && (dVar19 < (double)(lVar13 - (this->m_begin).__d.__r) / 1000000000.0))
         || (lVar16 = lVar16 + 1, lVar16 == (ctx->parameters).limit)) break;
    }
  }
  __return_storage_ptr__->status = limit_reached;
LAB_0023ca8f:
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,local_13c);
  }
  if (local_e8.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::~solver_equalities_01coeff(&local_b0);
  if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
      local_110.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_110.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      local_168.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_168.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
LAB_0023cb99:
  do {
    iVar10 = compute_order::
             push_and_run<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                       (&local_e8,&local_b0,(bit_array *)&local_168,this->m_rng,
                        auVar20._0_8_ * local_f8,local_158,(double)theta,local_100);
    if (iVar10 == 0) {
      dVar19 = default_cost_type<double>::results(local_150,(bit_array *)&local_168,local_148);
      store_if_better(this,(bit_array *)&local_168,dVar19,
                      (long)~((ctx->parameters).pushing_iteration_limit * iVar9));
    }
    lVar16 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar16;
    auVar20 = ZEXT864((ulong)auVar20._0_8_);
    dVar19 = (this->m_ctx->parameters).time_limit;
    if ((0.0 < dVar19) && (dVar19 < (double)(lVar16 - (this->m_begin).__d.__r) / 1000000000.0))
    break;
    if (0 < (ctx->parameters).pushing_iteration_limit) {
      iVar10 = 1;
      do {
        auVar24._0_8_ = auVar20._0_8_;
        iVar11 = compute_order::
                 run<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                           (&local_e8,&local_b0,(bit_array *)&local_168,this->m_rng,auVar24._0_8_,
                            local_158,(double)theta);
        if (iVar11 == 0) {
          dVar19 = default_cost_type<double>::results(local_150,(bit_array *)&local_168,local_148);
          store_if_better(this,(bit_array *)&local_168,dVar19,
                          (long)((ctx->parameters).pushing_iteration_limit * iVar15 - iVar10));
          auVar20 = ZEXT864((ulong)auVar24._0_8_);
          break;
        }
        if ((double)(iVar10 + -1) <= (ctx->parameters).w) {
          auVar25._8_8_ = 0;
          auVar25._0_8_ = auVar24._0_8_;
        }
        else {
          auVar20._0_8_ = pow((double)iVar11 / (double)local_b0.m,local_128);
          auVar20._8_56_ = extraout_var_00;
          auVar24._8_8_ = 0;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_120;
          auVar25 = vfmadd231sd_fma(auVar24,auVar20._0_16_,auVar3);
        }
        auVar20 = ZEXT1664(auVar25);
        dVar19 = auVar25._0_8_;
        if (local_118 < dVar19) break;
        lVar16 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar16;
        dVar18 = (this->m_ctx->parameters).time_limit;
        if ((0.0 < dVar18) && (dVar18 < (double)(lVar16 - (this->m_begin).__d.__r) / 1000000000.0))
        {
          auVar20 = ZEXT864((ulong)dVar19);
          break;
        }
        auVar20 = ZEXT864((ulong)dVar19);
        bVar5 = iVar10 < (ctx->parameters).pushing_iteration_limit;
        iVar10 = iVar10 + 1;
      } while (bVar5);
    }
    iVar9 = iVar9 + 1;
    iVar15 = iVar15 + -1;
  } while (iVar9 < (ctx->parameters).pushes_limit);
  goto LAB_0023ca8f;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }